

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.h
# Opt level: O0

bool __thiscall
helics::ipc::SharedQueueState::setState(SharedQueueState *this,queue_state_t newState)

{
  bool bVar1;
  undefined4 in_ESI;
  scoped_lock<boost::interprocess::interprocess_mutex> *in_RDI;
  lock_exception *anon_var_0;
  scoped_lock<boost::interprocess::interprocess_mutex> lock;
  int tries;
  bool success;
  mutex_type *in_stack_ffffffffffffff98;
  scoped_lock<boost::interprocess::interprocess_mutex> *in_stack_ffffffffffffffb0;
  
  bVar1 = false;
  while (!bVar1) {
    boost::interprocess::scoped_lock<boost::interprocess::interprocess_mutex>::scoped_lock
              (in_RDI,in_stack_ffffffffffffff98);
    *(undefined4 *)&in_RDI[2].m_locked = in_ESI;
    boost::interprocess::scoped_lock<boost::interprocess::interprocess_mutex>::~scoped_lock
              (in_stack_ffffffffffffffb0);
    bVar1 = true;
  }
  return true;
}

Assistant:

bool setState(queue_state_t newState)
        {
            bool success = false;
            int tries = 0;
            while (!success) {
                try {
                    boost::interprocess::scoped_lock<ipcmutex> lock(data_lock);
                    state = newState;
                    success = true;
                }
                catch (const boost::interprocess::lock_exception&) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(100));
                    ++tries;
                    if (tries > 20) {
                        std::cout << "error in connecting to process lock\n";
                        state = newState;
                        return false;
                    }
                }
            }
            return success;
        }